

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<slang::SourceBuffer>::reallocateTo
          (SmallVectorBase<slang::SourceBuffer> *this,size_type newCapacity)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_type sVar3;
  pointer pSVar4;
  undefined8 uVar5;
  pointer pSVar6;
  long lVar7;
  
  pSVar6 = (pointer)detail::allocArray(newCapacity,0x18);
  sVar3 = this->len;
  if (sVar3 != 0) {
    pSVar4 = this->data_;
    lVar7 = 0;
    do {
      *(undefined8 *)((long)&(pSVar6->id).id + lVar7) =
           *(undefined8 *)((long)&(pSVar4->id).id + lVar7);
      puVar1 = (undefined8 *)((long)&(pSVar4->data)._M_len + lVar7);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pSVar6->data)._M_len + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      lVar7 = lVar7 + 0x18;
    } while (sVar3 * 0x18 != lVar7);
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->cap = newCapacity;
  this->data_ = pSVar6;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)detail::allocArray(newCapacity, sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }